

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_d.h
# Opt level: O2

void __thiscall draco::VectorD<float,_3>::Normalize(VectorD<float,_3> *this)

{
  int i;
  long lVar1;
  Scalar __x;
  float fVar2;
  
  __x = SquaredNorm(this);
  if (__x < 0.0) {
    fVar2 = sqrtf(__x);
  }
  else {
    fVar2 = SQRT(__x);
  }
  if ((fVar2 != 0.0) || (NAN(fVar2))) {
    for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
      (this->v_)._M_elems[lVar1] = (this->v_)._M_elems[lVar1] / fVar2;
    }
  }
  return;
}

Assistant:

void Normalize() {
    const Scalar magnitude = std::sqrt(this->SquaredNorm());
    if (magnitude == 0) {
      return;
    }
    for (int i = 0; i < dimension; ++i) {
      (*this)[i] /= magnitude;
    }
  }